

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O2

int wally_asset_rangeproof_with_nonce
              (uint64_t value,uchar *nonce_hash,size_t nonce_hash_len,uchar *asset,size_t asset_len,
              uchar *abf,size_t abf_len,uchar *vbf,size_t vbf_len,uchar *commitment,
              size_t commitment_len,uchar *extra,size_t extra_len,uchar *generator,
              size_t generator_len,uint64_t min_value,int exp,int min_bits,uchar *bytes_out,
              size_t len,size_t *written)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  int iVar2;
  undefined1 auVar3 [16];
  secp256k1_pedersen_commitment commit;
  secp256k1_generator gen;
  uchar message [64];
  
  ctx = secp_ctx();
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (ctx == (secp256k1_context_struct *)0x0) {
    iVar2 = -3;
  }
  else {
    auVar3._0_4_ = -(uint)(nonce_hash == (uchar *)0x0);
    auVar3._4_4_ = -(uint)(asset == (uchar *)0x0);
    auVar3._8_4_ = -(uint)(abf == (uchar *)0x0);
    auVar3._12_4_ = -(uint)(vbf == (uchar *)0x0);
    iVar1 = movmskps((int)ctx,auVar3);
    iVar2 = -2;
    if ((((iVar1 == 0) && (bytes_out != (uchar *)0x0)) && (nonce_hash_len == 0x20)) &&
       (((asset_len == 0x20 && (abf_len == 0x20)) &&
        ((vbf_len == 0x20 && ((0x140d < len && (written != (size_t *)0x0)))))))) {
      iVar1 = get_commitment(ctx,commitment,commitment_len,&commit);
      if (iVar1 == 0) {
        if (((((uint)min_bits < 0x41) && (extra != (uchar *)0x0 || extra_len == 0)) &&
            (-1 < (long)min_value)) && (0xffffffeb < exp - 0x13U)) {
          iVar1 = get_generator(ctx,generator,generator_len,&gen);
          if (iVar1 == 0) {
            message._0_8_ = *(undefined8 *)asset;
            message._8_8_ = *(undefined8 *)(asset + 8);
            message._16_8_ = *(undefined8 *)(asset + 0x10);
            message._24_8_ = *(undefined8 *)(asset + 0x18);
            message._32_8_ = *(undefined8 *)abf;
            message._40_8_ = *(undefined8 *)(abf + 8);
            message._48_8_ = *(undefined8 *)(abf + 0x10);
            message._56_8_ = *(undefined8 *)(abf + 0x18);
            *written = 0x140e;
            iVar1 = secp256k1_rangeproof_sign
                              (ctx,bytes_out,written,min_value,&commit,vbf,nonce_hash,exp,min_bits,
                               value,message,0x40,extra,extra_len,&gen);
            iVar2 = 0;
            if (iVar1 == 0) {
              *written = 0;
              iVar2 = -1;
            }
          }
        }
      }
    }
    wally_clear_3(&gen,0x40,&commit,0x40,message,0x40);
  }
  return iVar2;
}

Assistant:

int wally_asset_rangeproof_with_nonce(uint64_t value,
                                      const unsigned char *nonce_hash, size_t nonce_hash_len,
                                      const unsigned char *asset, size_t asset_len,
                                      const unsigned char *abf, size_t abf_len,
                                      const unsigned char *vbf, size_t vbf_len,
                                      const unsigned char *commitment, size_t commitment_len,
                                      const unsigned char *extra, size_t extra_len,
                                      const unsigned char *generator, size_t generator_len,
                                      uint64_t min_value, int exp, int min_bits,
                                      unsigned char *bytes_out, size_t len,
                                      size_t *written)
{
    const secp256k1_context *ctx = secp_ctx();
    secp256k1_generator gen;
    secp256k1_pedersen_commitment commit;
    unsigned char message[ASSET_TAG_LEN * 2];
    int ret = WALLY_EINVAL;

    if (written)
        *written = 0;

    if (!ctx)
        return WALLY_ENOMEM;

    if (!nonce_hash || nonce_hash_len != SHA256_LEN ||
        !asset || asset_len != ASSET_TAG_LEN ||
        !abf || abf_len != BLINDING_FACTOR_LEN ||
        !vbf || vbf_len != BLINDING_FACTOR_LEN ||
        !bytes_out || len < ASSET_RANGEPROOF_MAX_LEN || !written ||
        get_commitment(ctx, commitment, commitment_len, &commit) != WALLY_OK ||
        /* FIXME: Is there an upper size limit on the extra commitment? */
        (extra_len && !extra) ||
        min_value > 0x7ffffffffffffffful ||
        exp < -1 || exp > 18 ||
        min_bits < 0 || min_bits > 64 ||
        get_generator(ctx, generator, generator_len, &gen) != WALLY_OK)
        goto cleanup;

    /* Create the rangeproof message */
    memcpy(message, asset, ASSET_TAG_LEN);
    memcpy(message + ASSET_TAG_LEN, abf, ASSET_TAG_LEN);

    *written = ASSET_RANGEPROOF_MAX_LEN;
    if (secp256k1_rangeproof_sign(ctx, bytes_out, written, min_value, &commit,
                                  vbf, nonce_hash, exp, min_bits, value,
                                  message, sizeof(message),
                                  extra, extra_len,
                                  &gen))
        ret = WALLY_OK;
    else {
        *written = 0;
        ret = WALLY_ERROR; /* Caller must retry with different blinding */
    }

cleanup:
    wally_clear_3(&gen, sizeof(gen), &commit, sizeof(commit),
                  message, sizeof(message));
    return ret;
}